

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::dasmMoveToCcr<(moira::Instr)74,(moira::Mode)4,2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  Syntax SVar1;
  StrWriter *pSVar2;
  Ea<(moira::Mode)4,_2> result;
  u32 local_34;
  ushort local_30;
  
  SVar1 = str->style->syntax;
  if (SVar1 - GNU < 2) {
    pSVar2 = StrWriter::operator<<(str);
    pSVar2 = StrWriter::operator<<(pSVar2);
    StrWriter::operator<<(pSVar2,(Tab)(str->tab).raw);
    local_30 = op & 7;
    local_34 = *addr;
    StrWriter::operator<<(pSVar2,(Ea<(moira::Mode)4,_2> *)&local_34);
  }
  else {
    if (SVar1 == MUSASHI) {
      pSVar2 = StrWriter::operator<<(str);
      StrWriter::operator<<(pSVar2,(Tab)(str->tab).raw);
    }
    else {
      pSVar2 = StrWriter::operator<<(str);
      pSVar2 = StrWriter::operator<<(pSVar2);
      StrWriter::operator<<(pSVar2,(Tab)(str->tab).raw);
    }
    local_30 = op & 7;
    local_34 = *addr;
    StrWriter::operator<<(pSVar2,(Ea<(moira::Mode)4,_1> *)&local_34);
  }
  StrWriter::operator<<(pSVar2);
  StrWriter::operator<<(pSVar2);
  return;
}

Assistant:

void
Moira::dasmMoveToCcr(StrWriter &str, u32 &addr, u16 op) const
{
    auto src = _____________xxx(op);

    switch (str.style.syntax) {

        case  Syntax::MUSASHI:

            str << Ins<I>{} << str.tab << Op<M, Byte>(src, addr) << Sep{} << Ccr{};
            break;

        case Syntax::GNU:
        case Syntax::GNU_MIT:

            str << Ins<I>{} << Sz<S>{} << str.tab << Op<M, S>(src, addr) << Sep{} << Ccr{};
            break;

        default:

            str << Ins<I>{} << Sz<S>{} << str.tab << Op<M, Byte>(src, addr) << Sep{} << Ccr{};
    }
}